

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QPixmapCache::Key>::emplace<QPixmapCache::Key_const&>
          (QMovableArrayOps<QPixmapCache::Key> *this,qsizetype i,Key *args)

{
  qsizetype *pqVar1;
  Key **ppKVar2;
  Data *pDVar3;
  Key *pKVar4;
  Key *pKVar5;
  Key *__dest;
  long in_FS_OFFSET;
  bool bVar6;
  Key tmp;
  Inserter local_60;
  Key local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QPixmapCache::Key>).
           super_QArrayDataPointer<QPixmapCache::Key>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_002b4e82:
    local_38.d = (KeyData *)&DAT_aaaaaaaaaaaaaaaa;
    QPixmapCache::Key::Key(&local_38,args);
    bVar6 = (this->super_QGenericArrayOps<QPixmapCache::Key>).
            super_QArrayDataPointer<QPixmapCache::Key>.size != 0;
    QArrayDataPointer<QPixmapCache::Key>::detachAndGrow
              ((QArrayDataPointer<QPixmapCache::Key> *)this,(uint)(i == 0 && bVar6),1,(Key **)0x0,
               (QArrayDataPointer<QPixmapCache::Key> *)0x0);
    if (i == 0 && bVar6) {
      pKVar4 = (this->super_QGenericArrayOps<QPixmapCache::Key>).
               super_QArrayDataPointer<QPixmapCache::Key>.ptr;
      pKVar4[-1].d = local_38.d;
      local_38.d = (KeyData *)0x0;
      (this->super_QGenericArrayOps<QPixmapCache::Key>).super_QArrayDataPointer<QPixmapCache::Key>.
      ptr = pKVar4 + -1;
      pqVar1 = &(this->super_QGenericArrayOps<QPixmapCache::Key>).
                super_QArrayDataPointer<QPixmapCache::Key>.size;
      *pqVar1 = *pqVar1 + 1;
    }
    else {
      pKVar5 = (this->super_QGenericArrayOps<QPixmapCache::Key>).
               super_QArrayDataPointer<QPixmapCache::Key>.ptr;
      pKVar4 = pKVar5 + i;
      __dest = pKVar4 + 1;
      local_60.nInserts = 1;
      local_60.bytes =
           ((this->super_QGenericArrayOps<QPixmapCache::Key>).
            super_QArrayDataPointer<QPixmapCache::Key>.size - i) * 8;
      local_60.data = (QArrayDataPointer<QPixmapCache::Key> *)this;
      local_60.displaceTo = __dest;
      memmove(__dest,pKVar5 + i,local_60.bytes);
      pKVar4->d = local_38.d;
      local_38.d = (KeyData *)0x0;
      local_60.displaceFrom = __dest;
      Inserter::~Inserter(&local_60);
    }
    QPixmapCache::Key::~Key(&local_38);
  }
  else {
    if (((this->super_QGenericArrayOps<QPixmapCache::Key>).
         super_QArrayDataPointer<QPixmapCache::Key>.size == i) &&
       (pKVar4 = (this->super_QGenericArrayOps<QPixmapCache::Key>).
                 super_QArrayDataPointer<QPixmapCache::Key>.ptr,
       (pDVar3->super_QArrayData).alloc !=
       ((long)((long)pKVar4 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) +
       i)) {
      QPixmapCache::Key::Key(pKVar4 + i,args);
    }
    else {
      if ((i != 0) ||
         (pKVar4 = (this->super_QGenericArrayOps<QPixmapCache::Key>).
                   super_QArrayDataPointer<QPixmapCache::Key>.ptr,
         (Key *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
         pKVar4)) goto LAB_002b4e82;
      QPixmapCache::Key::Key(pKVar4 + -1,args);
      ppKVar2 = &(this->super_QGenericArrayOps<QPixmapCache::Key>).
                 super_QArrayDataPointer<QPixmapCache::Key>.ptr;
      *ppKVar2 = *ppKVar2 + -1;
    }
    pqVar1 = &(this->super_QGenericArrayOps<QPixmapCache::Key>).
              super_QArrayDataPointer<QPixmapCache::Key>.size;
    *pqVar1 = *pqVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }